

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_buffers.cpp
# Opt level: O3

vector<unsigned_long,_std::allocator<unsigned_long>_> *
polyscope::render::getAttributeBufferDataRange<unsigned_long>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          AttributeBuffer *buff,size_t ind,size_t count)

{
  pointer puVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  vector<unsigned_int,_std::allocator<unsigned_int>_> uint32Vals;
  allocator_type local_29;
  void *local_28 [3];
  undefined1 auVar4 [32];
  
  (*buff->_vptr_AttributeBuffer[0x20])(local_28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,count,&local_29);
  if (count == 0) {
    if (local_28[0] == (void *)0x0) {
      return __return_storage_ptr__;
    }
  }
  else {
    auVar6 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    puVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = 0;
    auVar7 = vpbroadcastq_avx512f();
    do {
      auVar8 = vpbroadcastq_avx512f();
      auVar8 = vporq_avx512f(auVar8,auVar6);
      uVar2 = vpcmpuq_avx512f(auVar8,auVar7,2);
      auVar4 = vmovdqu32_avx512vl(*(undefined1 (*) [32])((long)local_28[0] + uVar3 * 4));
      auVar5._4_4_ = (uint)((byte)(uVar2 >> 1) & 1) * auVar4._4_4_;
      auVar5._0_4_ = (uint)((byte)uVar2 & 1) * auVar4._0_4_;
      auVar5._8_4_ = (uint)((byte)(uVar2 >> 2) & 1) * auVar4._8_4_;
      auVar5._12_4_ = (uint)((byte)(uVar2 >> 3) & 1) * auVar4._12_4_;
      auVar5._16_4_ = (uint)((byte)(uVar2 >> 4) & 1) * auVar4._16_4_;
      auVar5._20_4_ = (uint)((byte)(uVar2 >> 5) & 1) * auVar4._20_4_;
      auVar5._24_4_ = (uint)((byte)(uVar2 >> 6) & 1) * auVar4._24_4_;
      auVar5._28_4_ = (uint)(byte)(uVar2 >> 7) * auVar4._28_4_;
      auVar8 = vpmovzxdq_avx512f(auVar5);
      auVar8 = vmovdqu64_avx512f(auVar8);
      *(undefined1 (*) [64])(puVar1 + uVar3) = auVar8;
      uVar3 = uVar3 + 8;
    } while ((count + 7 & 0xfffffffffffffff8) != uVar3);
  }
  operator_delete(local_28[0]);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint64_t> getAttributeBufferDataRange<uint64_t>(AttributeBuffer& buff, size_t ind, size_t count) {
  std::vector<uint32_t> uint32Vals = buff.getDataRange_uint32(ind, count);
  std::vector<uint64_t> uint64Vals(count);
  for (size_t i = 0; i < count; i++) {
    uint64Vals[i] = static_cast<uint64_t>(uint32Vals[i]);
  }
  return uint64Vals;
}